

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

bool __thiscall cppnet::TimerContainer::RmTimer(TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t)

{
  _Atomic_word *p_Var1;
  int iVar2;
  TimerContainer *this_00;
  ulong uVar3;
  element_type *peVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  int iVar8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  TimerContainer *pTVar11;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar16;
  undefined1 uVar17;
  uint16_t cur_index;
  uint16_t type;
  uint16_t local_54;
  uint16_t local_52;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  
  this_01 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar8 = this_01->_M_use_count;
    do {
      if (iVar8 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_01->_M_use_count;
      bVar16 = iVar8 == iVar2;
      if (bVar16) {
        this_01->_M_use_count = iVar8 + 1;
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
      UNLOCK();
    } while (!bVar16);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar16 = true;
  }
  else {
    bVar16 = this_01->_M_use_count == 0;
  }
  this_00 = (TimerContainer *)
            (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (!(bool)(this_00 == (TimerContainer *)0x0 | bVar16)) {
    local_54 = 0;
    local_52 = 0;
    pTVar11 = this_00;
    TimerSlot::GetCurIndex((TimerSlot *)this_00,&local_54,&local_52);
    uVar5 = local_52;
    uVar6 = TimeUnit2TimeType(pTVar11,this->_time_unit);
    if (uVar5 == uVar6) {
      TimerSlot::RmInTimer((TimerSlot *)this_00);
      Bitmap::Remove(&this->_bitmap,(uint)local_54);
      uVar7 = TimerSlot::GetLeftInterval((TimerSlot *)this_00);
      uVar3 = (this->_timer_wheel)._M_h._M_bucket_count;
      uVar12 = (ulong)local_54 % uVar3;
      p_Var14 = (this->_timer_wheel)._M_h._M_buckets[uVar12 & 0xffffffff];
      p_Var15 = (__node_base_ptr)0x0;
      if (p_Var14 != (__node_base_ptr)0x0) {
        p_Var9 = p_Var14->_M_nxt;
        p_Var15 = p_Var14;
        if (*(uint *)&p_Var14->_M_nxt[1]._M_nxt != (uint)local_54) {
          while (p_Var14 = p_Var9, p_Var9 = p_Var14->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
            p_Var15 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar3 != uVar12) ||
               (p_Var15 = p_Var14, *(uint *)&p_Var9[1]._M_nxt == (uint)local_54)) goto LAB_0011467a;
          }
          p_Var15 = (__node_base_ptr)0x0;
        }
      }
LAB_0011467a:
      if (p_Var15 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var15->_M_nxt;
      }
      if (p_Var9 == (_Hash_node_base *)0x0) {
        uVar17 = 1;
      }
      else {
        if ((this->_sub_timer).
            super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          uVar7 = 0;
        }
        p_Var10 = p_Var9 + 3;
        p_Var13 = p_Var10;
        for (p_Var9 = p_Var9[4]._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
            p_Var9 = p_Var9[(ulong)bVar16 + 2]._M_nxt) {
          bVar16 = *(uint *)&p_Var9[4]._M_nxt < uVar7;
          if (!bVar16) {
            p_Var13 = p_Var9;
          }
        }
        p_Var9 = p_Var10;
        if ((p_Var13 != p_Var10) && (p_Var9 = p_Var13, uVar7 < *(uint *)&p_Var13[4]._M_nxt)) {
          p_Var9 = p_Var10;
        }
        uVar17 = p_Var9 != p_Var10;
        if ((bool)uVar17) {
          for (__position._M_node = (_List_node_base *)p_Var9[5]._M_nxt;
              __position._M_node != (_List_node_base *)(p_Var9 + 5);
              __position._M_node = (__position._M_node)->_M_next) {
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__position._M_node[1]._M_prev;
            if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar8 = this_02->_M_use_count;
              do {
                if (iVar8 == 0) {
                  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar2 = this_02->_M_use_count;
                bVar16 = iVar8 == iVar2;
                if (bVar16) {
                  this_02->_M_use_count = iVar8 + 1;
                  iVar2 = iVar8;
                }
                iVar8 = iVar2;
                UNLOCK();
              } while (!bVar16);
            }
            if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar16 = true;
            }
            else {
              bVar16 = this_02->_M_use_count == 0;
            }
            if (bVar16) {
              pTVar11 = (TimerContainer *)0x0;
            }
            else {
              pTVar11 = (TimerContainer *)__position._M_node[1]._M_next;
            }
            if (pTVar11 == this_00) {
              std::__cxx11::
              list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
              ::_M_erase((list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                          *)(p_Var9 + 5),__position);
              if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
              }
              break;
            }
            if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
            }
          }
        }
      }
      goto LAB_0011450d;
    }
    peVar4 = (this->_sub_timer).
             super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4 != (element_type *)0x0) {
      local_50 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_48 = (t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_weak_count = local_48->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_weak_count = local_48->_M_weak_count + 1;
        }
      }
      iVar8 = (*(peVar4->super_Timer)._vptr_Timer[1])(peVar4,&local_50);
      uVar17 = (undefined1)iVar8;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_48->_M_weak_count;
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = local_48->_M_weak_count;
          local_48->_M_weak_count = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (*local_48->_vptr__Sp_counted_base[3])();
        }
      }
      goto LAB_0011450d;
    }
  }
  uVar17 = 0;
LAB_0011450d:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (bool)uVar17;
}

Assistant:

bool TimerContainer::RmTimer(std::weak_ptr<TimerSlot> t) {
    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    uint16_t cur_index = 0;
    uint16_t type = 0;
    ptr->GetCurIndex(cur_index, type);
    if (type == TimeUnit2TimeType(_time_unit)) {
        ptr->RmInTimer();
        _bitmap.Remove(cur_index);
        uint32_t left_time = ptr->GetLeftInterval();
        auto timer_map = _timer_wheel.find(cur_index);
        if (timer_map == _timer_wheel.end()) {
            return true;
        }
        // don't have sub timer
        if (!_sub_timer) {
            left_time = 0;
        }
        auto timer_list = timer_map->second.find(left_time);
        if (timer_list == timer_map->second.end()) {
            return false;
        }
        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); ++timer) {
            auto target = timer->lock();
            if (target == ptr) {
                timer_list->second.erase(timer);
                return true;
            }
        }
        return true;
    }

    if (_sub_timer) {
        return _sub_timer->RmTimer(t);
    }
    return false;
}